

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_listener_base.cpp
# Opt level: O2

int __thiscall zmq::stream_listener_base_t::close(stream_listener_base_t *this,int __fd)

{
  socket_base_t *this_00;
  int iVar1;
  int *piVar2;
  char *errmsg_;
  endpoint_uri_pair_t local_60;
  
  iVar1 = this->_s;
  if (iVar1 == -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s != retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_listener_base.cpp"
            ,0x56);
    fflush(_stderr);
    zmq_abort("_s != retired_fd");
    iVar1 = this->_s;
  }
  iVar1 = ::close(iVar1);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    errmsg_ = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_listener_base.cpp"
            ,0x5c);
    fflush(_stderr);
    zmq_abort(errmsg_);
  }
  this_00 = this->_socket;
  make_unconnected_bind_endpoint_pair(&local_60,&this->_endpoint);
  socket_base_t::event_closed(this_00,&local_60,this->_s);
  endpoint_uri_pair_t::~endpoint_uri_pair_t(&local_60);
  this->_s = -1;
  return 0;
}

Assistant:

int zmq::stream_listener_base_t::close ()
{
    // TODO this is identical to stream_connector_base_t::close

    zmq_assert (_s != retired_fd);
#ifdef ZMQ_HAVE_WINDOWS
    const int rc = closesocket (_s);
    wsa_assert (rc != SOCKET_ERROR);
#else
    const int rc = ::close (_s);
    errno_assert (rc == 0);
#endif
    _socket->event_closed (make_unconnected_bind_endpoint_pair (_endpoint), _s);
    _s = retired_fd;

    return 0;
}